

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

int polymon(int mntmp)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  int local_13c;
  char *local_130;
  bool local_11c;
  bool local_11b;
  byte local_11a;
  byte local_119;
  char local_118 [8];
  char kbuf [256];
  int mlvl;
  boolean could_pass_walls;
  boolean dochange;
  boolean was_blind;
  boolean sticky;
  int mntmp_local;
  
  bVar1 = sticks(youmonst.data);
  local_119 = 0;
  if ((bVar1 != '\0') && (local_119 = 0, u.ustuck != (monst *)0x0)) {
    local_119 = (u._1052_1_ & 1) != 0 ^ 0xff;
  }
  kbuf[0xff] = local_119 & 1;
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (local_11a = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    local_11b = false;
    if (ublindf != (obj *)0x0) {
      local_11b = ublindf->oartifact == '\x1d';
    }
    local_11a = local_11b ^ 0xff;
  }
  kbuf[0xfe] = local_11a & 1;
  kbuf[0xfd] = '\0';
  local_11c = true;
  if ((u.uprops[0x3e].intrinsic == 0) && (local_11c = true, u.uprops[0x3e].extrinsic == 0)) {
    local_11c = ((youmonst.data)->mflags1 & 8) != 0;
  }
  kbuf[0xfc] = local_11c;
  if ((mvitals[mntmp].mvflags & 2) == 0) {
    u.uconduct.polyselfs = u.uconduct.polyselfs + 1;
    if (u.umonnum == u.umonster) {
      u._1052_1_ = u._1052_1_ & 0xf7 | (flags.female & 1U) << 3;
    }
    else {
      u.acurr.a[0] = u.macurr.a[0];
      u.acurr.a[1] = u.macurr.a[1];
      u.acurr.a[2] = u.macurr.a[2];
      u.acurr.a[3] = u.macurr.a[3];
      u.acurr.a[4] = u.macurr.a[4];
      u.acurr.a[5] = u.macurr.a[5];
      u.amax.a[0] = u.mamax.a[0];
      u.amax.a[1] = u.mamax.a[1];
      u.amax.a[2] = u.mamax.a[2];
      u.amax.a[3] = u.mamax.a[3];
      u.amax.a[4] = u.mamax.a[4];
      u.amax.a[5] = u.mamax.a[5];
      flags.female = (byte)u._1052_1_ >> 3 & 1;
    }
    u.macurr.a._0_4_ = u.acurr.a._0_4_;
    u.macurr.a._4_2_ = u.acurr.a._4_2_;
    u.mamax.a._0_4_ = u.amax.a._0_4_;
    u.mamax.a._4_2_ = u.amax.a._4_2_;
    if (youmonst.m_ap_type == '\0') {
      if (mons[mntmp].mlet != '\r') {
        youmonst.m_ap_type = '\0';
      }
    }
    else if (multi < 0) {
      unmul("");
    }
    if ((mons[mntmp].mflags2 & 0x10000) == 0) {
      if ((mons[mntmp].mflags2 & 0x20000) == 0) {
        if ((((mons[mntmp].mflags2 & 0x40000) == 0) && (mntmp != u.ulycn)) &&
           (iVar3 = rn2(10), iVar3 == 0)) {
          kbuf[0xfd] = '\x01';
        }
      }
      else if (flags.female == '\0') {
        kbuf[0xfd] = '\x01';
      }
    }
    else if (flags.female != '\0') {
      kbuf[0xfd] = '\x01';
    }
    if (kbuf[0xfd] == '\0') {
      if (u.umonnum == mntmp) {
        pcVar4 = mons_mname(mons + mntmp);
        pline("You feel like a new %s!",pcVar4);
      }
      else {
        pcVar4 = mons_mname(mons + mntmp);
        pcVar4 = an(pcVar4);
        pline("You turn into %s!",pcVar4);
      }
    }
    else {
      flags.female = (flags.female != '\0' ^ 0xffU) & 1;
      pcVar4 = "feel like a new";
      if (u.umonnum != mntmp) {
        pcVar4 = "turn into a";
      }
      if (((mons[mntmp].mflags2 & 0x10000) == 0) && ((mons[mntmp].mflags2 & 0x20000) == 0)) {
        local_130 = "male ";
        if (flags.female != 0) {
          local_130 = "female ";
        }
      }
      else {
        local_130 = "";
      }
      pcVar5 = mons_mname(mons + mntmp);
      pline("You %s %s%s!",pcVar4,local_130,pcVar5);
    }
    mlvl = mntmp;
    if ((u.uprops[0x21].intrinsic != 0) && (bVar1 = poly_when_stoned(mons + mntmp), bVar1 != '\0'))
    {
      pline("You turn to stone!");
      mlvl = 0x108;
      u.uprops[0x21].intrinsic = 0;
      delayed_killer = (char *)0x0;
    }
    iVar3 = rn2(500);
    u.mtimedone = iVar3 + 500;
    u.umonnum = mlvl;
    set_uasmon();
    if ((mons[mlvl].mflags2 & 0x4000000) != 0) {
      u.amax.a[0] = 'v';
      u.acurr.a[0] = 'v';
    }
    if (((u.uprops[8].extrinsic != 0) || ((youmonst.mintrinsics & 0x80) != 0)) &&
       (u.uprops[0x21].intrinsic != 0)) {
      u.uprops[0x21].intrinsic = 0;
      delayed_killer = (char *)0x0;
      pline("You no longer seem to be petrifying.");
    }
    if ((((u.uprops[0x34].intrinsic != 0) || ((youmonst.data)->mlet == ' ')) ||
        ((youmonst.data == mons + 0xfd || (bVar1 = defends(0x21,uwep), bVar1 != '\0')))) &&
       (u.uprops[0x1d].intrinsic != 0)) {
      make_sick(0,(char *)0x0,'\0',3);
      pline("You no longer feel sick.");
    }
    if (u.uprops[0x3a].intrinsic != 0) {
      if (((youmonst.data == mons + 0x73) || (youmonst.data == mons + 0x20)) ||
         ((youmonst.data == mons + 0xa0 || (youmonst.data == mons + 0x157)))) {
        pline("The slime burns away!");
        u.uprops[0x3a].intrinsic = 0;
        iflags.botl = '\x01';
      }
      else if (mlvl == 0xd7) {
        u.uprops[0x3a].intrinsic = 0;
        iflags.botl = '\x01';
      }
    }
    if (((youmonst.data)->mflags1 & 0x2000) != 0) {
      u.uprops[0x29].intrinsic = 0;
    }
    kbuf._248_4_ = SEXT14(mons[mlvl].mlevel);
    if (((youmonst.data)->mlet == '\x1e') && (0x92 < mlvl)) {
      if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
        local_13c = kbuf._248_4_ << 3;
      }
      else {
        local_13c = kbuf._248_4_ * 4;
        iVar3 = dice(kbuf._248_4_,4);
        local_13c = local_13c + iVar3;
      }
      u.mhmax = local_13c;
    }
    else if ((youmonst.data)->mlet == '7') {
      u.mhmax = golemhp(mlvl);
    }
    else {
      if (kbuf._248_4_ == 0) {
        u.mhmax = rnd(4);
      }
      else {
        u.mhmax = dice(kbuf._248_4_,8);
      }
      bVar1 = is_home_elemental(&u.uz,mons + mlvl);
      if (bVar1 != '\0') {
        u.mhmax = u.mhmax * 3;
      }
    }
    u.mh = u.mhmax;
    if (u.ulevel < (int)kbuf._248_4_) {
      u.mtimedone = (u.mtimedone * u.ulevel) / (int)kbuf._248_4_;
    }
    if ((uskin != (obj *)0x0) && (iVar3 = armor_to_dragon((int)uskin->otyp), mlvl != iVar3)) {
      skinback('\0');
    }
    break_armor();
    drop_weapon(1);
    if (((youmonst.data)->mflags1 & 0x80) == 0) {
      if ((youmonst.data)->mlet == '9') {
        bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
        u._1052_1_ = u._1052_1_ & 0xfb | (bVar2 & 1) << 2;
      }
      else {
        u._1052_1_ = u._1052_1_ & 0xfb;
      }
    }
    else {
      u._1052_1_ = u._1052_1_ & 0xfb | (level->objects[u.ux][u.uy] != (obj *)0x0) << 2;
    }
    if (u.utraptype == 1) {
      if ((((kbuf[0xfc] == '\0') || (u.uprops[0x3e].intrinsic != 0)) ||
          (u.uprops[0x3e].extrinsic != 0)) || (((youmonst.data)->mflags1 & 8) != 0)) {
        if ((kbuf[0xfc] == '\0') &&
           (((u.uprops[0x3e].intrinsic != 0 || (u.uprops[0x3e].extrinsic != 0)) ||
            (((youmonst.data)->mflags1 & 8) != 0)))) {
          u.utrap = 0;
        }
      }
      else {
        iVar3 = rn2(6);
        u.utrap = iVar3 + 2;
      }
    }
    if ((kbuf[0xfe] != '\0') &&
       ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      u.uprops[0x1e].intrinsic = 1;
      make_blinded(0,'\x01');
    }
    newsym((int)u.ux,(int)u.uy);
    if ((((kbuf[0xff] == '\0') && ((u._1052_1_ & 1) == 0)) && (u.ustuck != (monst *)0x0)) &&
       (bVar1 = sticks(youmonst.data), bVar1 != '\0')) {
      u.ustuck = (monst *)0x0;
      u._1052_1_ = u._1052_1_ & 0x7f;
    }
    else if ((kbuf[0xff] != '\0') && (bVar1 = sticks(youmonst.data), bVar1 == '\0')) {
      uunstick();
    }
    if (u.usteed != (monst *)0x0) {
      if ((((u.usteed)->data == mons + 0xc) || ((u.usteed)->data == mons + 0xb)) &&
         ((u.uprops[8].extrinsic == 0 &&
          (((youmonst.mintrinsics & 0x80) == 0 && (iVar3 = rnl(3), iVar3 != 0)))))) {
        pcVar4 = mon_nam(u.usteed);
        pline("No longer petrifying-resistant, you touch %s.",pcVar4);
        pcVar4 = mons_mname((u.usteed)->data);
        pcVar4 = an(pcVar4);
        sprintf(local_118,"riding %s",pcVar4);
        bVar1 = delayed_petrify((char *)0x0,local_118);
        if (bVar1 != '\0') {
          dismount_steed(1);
        }
      }
      if ((u.usteed != (monst *)0x0) && (bVar1 = can_ride(u.usteed), bVar1 == '\0')) {
        dismount_steed(3);
      }
    }
    if (flags.verbose != '\0') {
      bVar1 = attacktype(youmonst.data,0xc);
      if (bVar1 != '\0') {
        pline("Use the command #%s to %s.","monster","use your breath weapon");
      }
      bVar1 = attacktype(youmonst.data,10);
      if (bVar1 != '\0') {
        pline("Use the command #%s to %s.","monster","spit venom");
      }
      if ((youmonst.data)->mlet == '\x0e') {
        pline("Use the command #%s to %s.","monster","remove an iron ball");
      }
      bVar1 = attacktype(youmonst.data,0xf);
      if (bVar1 != '\0') {
        pline("Use the command #%s to %s.","monster","gaze at monsters");
      }
      if (((youmonst.data)->mflags1 & 0x100) != 0) {
        pline("Use the command #%s to %s.","monster","hide");
      }
      if (((youmonst.data)->mflags2 & 4) != 0) {
        pline("Use the command #%s to %s.","monster","summon help");
      }
      if ((youmonst.data == mons + 0x62) || (youmonst.data == mons + 100)) {
        pline("Use the command #%s to %s.","monster","spin a web");
      }
      if (u.umonnum == 0x29) {
        pline("Use the command #%s to %s.","monster","multiply in a fountain");
      }
      if (((youmonst.data)->mlet == '\x15') && (((youmonst.data)->mflags2 & 0x20000000) != 0)) {
        pline("Use the command #%s to %s.","monster","use your horn");
      }
      if ((youmonst.data == mons + 0x31) || (youmonst.data == mons + 0x32)) {
        pline("Use the command #%s to %s.","monster","emit a mental blast");
      }
      if ((youmonst.data)->msound == '\x0f') {
        pline("Use the command #%s to %s.","monster","shriek");
      }
      if ((((youmonst.data)->mflags1 & 0x400000) != 0) && (flags.female != '\0')) {
        pline("Use the command #%s to %s.","sit","lay an egg");
      }
    }
    if (((youmonst.data)->mflags1 & 0x400000) != 0) {
      learn_egg_type(u.umonnum);
      iVar3 = egg_type_from_parent(u.umonnum,'\x01');
      learn_egg_type(iVar3);
    }
    find_ac();
    if ((((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
          ((youmonst.data)->mlet != '\x05')) &&
         (((u.ustuck == (monst *)0x0 && (u.uprops[0x3c].extrinsic == 0)) &&
          ((((youmonst.data)->mflags1 & 1) == 0 &&
           ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))))))) &&
        ((bVar1 = is_pool(level,(int)u.ux,(int)u.uy), bVar1 != '\0' ||
         (bVar1 = is_lava(level,(int)u.ux,(int)u.uy), bVar1 != '\0')))) ||
       (((((((byte)u._1052_1_ >> 1 & 1) != 0 && (u.uprops[0x39].intrinsic == 0)) &&
          (u.uprops[0x39].extrinsic == 0)) && (((youmonst.data)->mflags1 & 2) == 0)) &&
        ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))))) {
      spoteffects('\x01');
    }
    if ((((u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
        (((youmonst.data)->mflags1 & 8) == 0)) || ((u.utrap == 0 || (u.utraptype != 4)))) {
      if (((youmonst.data == mons + 0xa0) || (youmonst.data == mons + 0x157)) &&
         ((u.utrap != 0 && (u.utraptype == 3)))) {
        u.utrap = 0;
        pline("The lava now feels soothing.");
      }
    }
    else {
      u.utrap = 0;
      pline("The rock seems to no longer trap you.");
    }
    if (((((((youmonst.data)->mflags1 & 4) != 0) || ((youmonst.data)->mlet == '\x16')) ||
         (youmonst.data == mons + 0x9f)) || (((youmonst.data)->mflags1 & 0x100000) != 0)) &&
       (uball != (obj *)0x0)) {
      pline("You slip out of the iron chain.");
      unpunish();
    }
    if (((u.utrap != 0) && ((u.utraptype == 2 || (u.utraptype == 0)))) &&
       ((((youmonst.data)->mflags1 & 4) != 0 ||
        ((((youmonst.data)->mlet == '\x16' || (youmonst.data == mons + 0x9f)) ||
         ((((youmonst.data)->mflags1 & 0x100000) != 0 ||
          (((youmonst.data)->msize < 2 && (u.utraptype == 0)))))))))) {
      pline("You are no longer stuck in the %s.");
      u.utrap = 0;
    }
    if ((((youmonst.data == mons + 0x62) || (youmonst.data == mons + 100)) && (u.utrap != 0)) &&
       (u.utraptype == 2)) {
      pline("You orient yourself on the web.");
      u.utrap = 0;
    }
    iflags.botl = '\x01';
    vision_full_recalc = '\x01';
    see_monsters();
    exercise(4,'\0');
    exercise(2,'\x01');
    encumber_msg();
    _could_pass_walls = 1;
  }
  else {
    pcVar4 = mons_mname(mons + mntmp);
    pline("You feel rather %s-ish.",pcVar4);
    exercise(2,'\x01');
    _could_pass_walls = 0;
  }
  return _could_pass_walls;
}

Assistant:

int polymon(int mntmp)
{
	boolean sticky = sticks(youmonst.data) && u.ustuck && !u.uswallow,
		was_blind = !!Blind, dochange = FALSE;
	boolean could_pass_walls = Passes_walls;
	int mlvl;

	if (mvitals[mntmp].mvflags & G_GENOD) {	/* allow G_EXTINCT */
		pline("You feel rather %s-ish.", mons_mname(&mons[mntmp]));
		exercise(A_WIS, TRUE);
		return 0;
	}

	/* KMH, conduct */
	u.uconduct.polyselfs++;

	if (!Upolyd) {
		/* Human to monster; save human stats */
		u.macurr = u.acurr;
		u.mamax = u.amax;
		u.mfemale = flags.female;
	} else {
		/* Monster to monster; restore human stats, to be
		 * immediately changed to provide stats for the new monster
		 */
		u.acurr = u.macurr;
		u.amax = u.mamax;
		flags.female = u.mfemale;
	}

	if (youmonst.m_ap_type) {
	    /* stop mimicking immediately */
	    if (multi < 0) unmul("");
	} else if (mons[mntmp].mlet != S_MIMIC) {
	    /* as in polyman() */
	    youmonst.m_ap_type = M_AP_NOTHING;
	}
	if (is_male(&mons[mntmp])) {
		if (flags.female) dochange = TRUE;
	} else if (is_female(&mons[mntmp])) {
		if (!flags.female) dochange = TRUE;
	} else if (!is_neuter(&mons[mntmp]) && mntmp != u.ulycn) {
		if (!rn2(10)) dochange = TRUE;
	}
	if (dochange) {
		flags.female = !flags.female;
		pline("You %s %s%s!",
		    (u.umonnum != mntmp) ? "turn into a" : "feel like a new",
		    (is_male(&mons[mntmp]) || is_female(&mons[mntmp])) ? "" :
			flags.female ? "female " : "male ",
		    mons_mname(&mons[mntmp]));
	} else {
		if (u.umonnum != mntmp)
			pline("You turn into %s!", an(mons_mname(&mons[mntmp])));
		else
			pline("You feel like a new %s!", mons_mname(&mons[mntmp]));
	}
	if (Stoned && poly_when_stoned(&mons[mntmp])) {
		/* poly_when_stoned already checked stone golem genocide */
		pline("You turn to stone!");
		mntmp = PM_STONE_GOLEM;
		Stoned = 0;
		delayed_killer = 0;
	}

	u.mtimedone = rn1(500, 500);
	u.umonnum = mntmp;
	set_uasmon();

	/* New stats for monster, to last only as long as polymorphed.
	 * Currently only strength gets changed.
	 */
	if (strongmonst(&mons[mntmp])) ABASE(A_STR) = AMAX(A_STR) = STR18(100);

	if (Stone_resistance && Stoned) { /* parnes@eniac.seas.upenn.edu */
		Stoned = 0;
		delayed_killer = 0;
		pline("You no longer seem to be petrifying.");
	}
	if (Sick_resistance && Sick) {
		make_sick(0L, NULL, FALSE, SICK_ALL);
		pline("You no longer feel sick.");
	}
	if (Slimed) {
	    if (flaming(youmonst.data)) {
		pline("The slime burns away!");
		Slimed = 0L;
		iflags.botl = 1;
	    } else if (mntmp == PM_GREEN_SLIME) {
		/* do it silently */
		Slimed = 0L;
		iflags.botl = 1;
	    }
	}
	if (nohands(youmonst.data)) Glib = 0;

	/*
	mlvl = adj_lev(&mons[mntmp]);
	 * We can't do the above, since there's no such thing as an
	 * "experience level of you as a monster" for a polymorphed character.
	 */
	mlvl = (int)mons[mntmp].mlevel;
	if (youmonst.data->mlet == S_DRAGON && mntmp >= PM_GRAY_DRAGON) {
		u.mhmax = In_endgame(&u.uz) ? (8*mlvl) : (4*mlvl + dice(mlvl,4));
	} else if (is_golem(youmonst.data)) {
		u.mhmax = golemhp(mntmp);
	} else {
		if (!mlvl) u.mhmax = rnd(4);
		else u.mhmax = dice(mlvl, 8);
		if (is_home_elemental(&u.uz, &mons[mntmp])) u.mhmax *= 3;
	}
	u.mh = u.mhmax;

	if (u.ulevel < mlvl) {
	/* Low level characters can't become high level monsters for long */
		u.mtimedone = u.mtimedone * u.ulevel / mlvl;
	}

	if (uskin && mntmp != armor_to_dragon(uskin->otyp))
		skinback(FALSE);
	break_armor();
	drop_weapon(1);
	if (hides_under(youmonst.data))
		u.uundetected = OBJ_AT(u.ux, u.uy);
	else if (youmonst.data->mlet == S_EEL)
		u.uundetected = is_pool(level, u.ux, u.uy);
	else
		u.uundetected = 0;

	if (u.utraptype == TT_PIT) {
	    if (could_pass_walls && !Passes_walls) {
		u.utrap = rn1(6,2);
	    } else if (!could_pass_walls && Passes_walls) {
		u.utrap = 0;
	    }
	}
	if (was_blind && !Blind) {	/* previous form was eyeless */
	    Blinded = 1L;
	    make_blinded(0L, TRUE);	/* remove blindness */
	}
	newsym(u.ux,u.uy);		/* Change symbol */

	if (!sticky && !u.uswallow && u.ustuck && sticks(youmonst.data)) {
	    u.ustuck = 0;
	    u.uwilldrown = 0;
	} else if (sticky && !sticks(youmonst.data)) {
	    uunstick();
	}

	if (u.usteed) {
	    if (touch_petrifies(u.usteed->data) && !Stone_resistance && rnl(3)) {
		char kbuf[BUFSZ];

		pline("No longer petrifying-resistant, you touch %s.",
				mon_nam(u.usteed));
		sprintf(kbuf, "riding %s", an(mons_mname(u.usteed->data)));
		if (delayed_petrify(NULL, kbuf))
		    dismount_steed(DISMOUNT_FELL);
	    }
	    if (u.usteed && !can_ride(u.usteed))
		dismount_steed(DISMOUNT_POLY);
	}

	if (flags.verbose) {
	    static const char use_thec[] = "Use the command #%s to %s.";
	    static const char monsterc[] = "monster";
	    if (can_breathe(youmonst.data))
		pline(use_thec,monsterc,"use your breath weapon");
	    if (attacktype(youmonst.data, AT_SPIT))
		pline(use_thec,monsterc,"spit venom");
	    if (youmonst.data->mlet == S_NYMPH)
		pline(use_thec,monsterc,"remove an iron ball");
	    if (attacktype(youmonst.data, AT_GAZE))
		pline(use_thec,monsterc,"gaze at monsters");
	    if (is_hider(youmonst.data))
		pline(use_thec,monsterc,"hide");
	    if (is_were(youmonst.data))
		pline(use_thec,monsterc,"summon help");
	    if (webmaker(youmonst.data))
		pline(use_thec,monsterc,"spin a web");
	    if (u.umonnum == PM_GREMLIN)
		pline(use_thec,monsterc,"multiply in a fountain");
	    if (is_unicorn(youmonst.data))
		pline(use_thec,monsterc,"use your horn");
	    if (is_mind_flayer(youmonst.data))
		pline(use_thec,monsterc,"emit a mental blast");
	    if (youmonst.data->msound == MS_SHRIEK) /* worthless, actually */
		pline(use_thec,monsterc,"shriek");
	    if (lays_eggs(youmonst.data) && flags.female)
		pline(use_thec,"sit","lay an egg");
	}
	/* you now know what an egg of your type looks like */
	if (lays_eggs(youmonst.data)) {
	    learn_egg_type(u.umonnum);
	    /* make queen bees recognize killer bee eggs */
	    learn_egg_type(egg_type_from_parent(u.umonnum, TRUE));
	}
	find_ac();
	if ((!Levitation && !u.ustuck && !Flying &&
	    (is_pool(level, u.ux,u.uy) || is_lava(level, u.ux,u.uy))) ||
	   (Underwater && !Swimming))
	    spoteffects(TRUE);
	if (Passes_walls && u.utrap && u.utraptype == TT_INFLOOR) {
	    u.utrap = 0;
	    pline("The rock seems to no longer trap you.");
	} else if (likes_lava(youmonst.data) && u.utrap && u.utraptype == TT_LAVA) {
	    u.utrap = 0;
	    pline("The lava now feels soothing.");
	}
	if (amorphous(youmonst.data) || is_whirly(youmonst.data) || unsolid(youmonst.data)) {
	    if (Punished) {
		pline("You slip out of the iron chain.");
		unpunish();
	    }
	}
	if (u.utrap && (u.utraptype == TT_WEB || u.utraptype == TT_BEARTRAP) &&
		(amorphous(youmonst.data) || is_whirly(youmonst.data) || unsolid(youmonst.data) ||
		  (youmonst.data->msize <= MZ_SMALL && u.utraptype == TT_BEARTRAP))) {
	    pline("You are no longer stuck in the %s.",
		    u.utraptype == TT_WEB ? "web" : "bear trap");
	    /* probably should burn webs too if PM_FIRE_ELEMENTAL */
	    u.utrap = 0;
	}
	if (webmaker(youmonst.data) && u.utrap && u.utraptype == TT_WEB) {
	    pline("You orient yourself on the web.");
	    u.utrap = 0;
	}
	iflags.botl = 1;
	vision_full_recalc = 1;
	see_monsters();
	exercise(A_CON, FALSE);
	exercise(A_WIS, TRUE);
	encumber_msg();
	return 1;
}